

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  bool bVar1;
  SQString *x;
  SQObjectPtr b;
  SQObjectPtr a;
  SQObjectPtr local_40;
  SQObjectPtr local_30;
  
  local_30.super_SQObject._type = OT_NULL;
  local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = ToString(this,str,&local_30);
  if (bVar1) {
    bVar1 = ToString(this,obj,&local_40);
    if (bVar1) {
      x = SQString::Concat(this->_sharedstate,(local_30.super_SQObject._unVal.pString)->_val,
                           (local_30.super_SQObject._unVal.pString)->_len,
                           (local_40.super_SQObject._unVal.pString)->_val,
                           (local_40.super_SQObject._unVal.pString)->_len);
      bVar1 = true;
      SQObjectPtr::operator=(dest,x);
      goto LAB_00119d2d;
    }
  }
  bVar1 = false;
LAB_00119d2d:
  SQObjectPtr::~SQObjectPtr(&local_40);
  SQObjectPtr::~SQObjectPtr(&local_30);
  return bVar1;
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
#ifdef SQ_NO_FAST_STRINGCAT
    SQChar* s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
#else
    dest = SQString::Concat(_ss(this),_stringval(a),l,_stringval(b),ol);
#endif
    return true;
}